

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagShortArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,
              uint16_t *value)

{
  uint16_t *value_local;
  uint32_t count_local;
  uint16_t tag_local;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    tif_local._4_4_ = 1;
  }
  else {
    tif_local._4_4_ = TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,tag,count,value);
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFWriteDirectoryTagShortArray(TIFF *tif, uint32_t *ndir,
                                           TIFFDirEntry *dir, uint16_t tag,
                                           uint32_t count, uint16_t *value)
{
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    return (TIFFWriteDirectoryTagCheckedShortArray(tif, ndir, dir, tag, count,
                                                   value));
}